

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_test(stbi__context *s)

{
  int iVar1;
  undefined8 *__ptr;
  stbi__jpeg *in_RDI;
  stbi__jpeg *j;
  int r;
  int in_stack_fffffffffffffff4;
  
  __ptr = (undefined8 *)stbi__malloc(0x15de63);
  *__ptr = in_RDI;
  stbi__setup_jpeg((stbi__jpeg *)0x15de7c);
  iVar1 = stbi__decode_jpeg_header(in_RDI,in_stack_fffffffffffffff4);
  stbi__rewind((stbi__context *)in_RDI);
  free(__ptr);
  return iVar1;
}

Assistant:

static int stbi__jpeg_test(stbi__context *s)
{
   int r;
   stbi__jpeg* j = (stbi__jpeg*)stbi__malloc(sizeof(stbi__jpeg));
   j->s = s;
   stbi__setup_jpeg(j);
   r = stbi__decode_jpeg_header(j, STBI__SCAN_type);
   stbi__rewind(s);
   STBI_FREE(j);
   return r;
}